

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_write_to_stream__pulse
                    (ma_device *pDevice,ma_pa_stream *pStream,ma_uint64 *pFramesProcessed)

{
  undefined1 auVar1 [16];
  int iVar2;
  ma_uint64 frameCount;
  ma_result mVar3;
  uint uVar4;
  bool bVar5;
  size_t bytesMapped;
  void *pMappedPCMFrames;
  ulong local_48;
  void *local_40;
  ma_uint64 *local_38;
  
  if (pStream == (ma_pa_stream *)0x0) {
    __assert_fail("pStream != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                  ,0x75ae,
                  "ma_result ma_device_write_to_stream__pulse(ma_device *, ma_pa_stream *, ma_uint64 *)"
                 );
  }
  uVar4 = (&DAT_001d0e20)[(pDevice->playback).internalFormat] * (pDevice->playback).internalChannels
  ;
  if (uVar4 == 0) {
    __assert_fail("bpf > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                  ,0x75b1,
                  "ma_result ma_device_write_to_stream__pulse(ma_device *, ma_pa_stream *, ma_uint64 *)"
                 );
  }
  mVar3 = MA_SUCCESS;
  if (pDevice == (ma_device *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = ((pDevice->state).value & ~ma_device_state_stopped) == ma_device_state_started;
  }
  local_38 = pFramesProcessed;
  local_48 = (*(pDevice->pContext->field_14).alsa.snd_pcm_info)(pStream);
  if (local_48 != 0xffffffffffffffff) {
    if (local_48 == 0) goto LAB_00143677;
    iVar2 = (*(pDevice->pContext->field_14).alsa.snd_pcm_avail)(pStream,&local_40,&local_48);
    if (-1 < iVar2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_48;
      auVar1 = auVar1 / ZEXT416(uVar4);
      frameCount = auVar1._0_8_;
      if (bVar5) {
        ma_device_handle_backend_data_callback(pDevice,local_40,(void *)0x0,auVar1._0_4_);
      }
      else {
        ma_silence_pcm_frames
                  (local_40,frameCount,(pDevice->playback).format,(pDevice->playback).channels);
      }
      iVar2 = (*(pDevice->pContext->field_14).alsa.snd_pcm_avail_update)
                        (pStream,local_40,local_48,0,0,0);
      local_48 = frameCount;
      if (iVar2 < 0) {
        local_48 = 0;
      }
      mVar3 = iVar2 >> 0x1f;
      goto LAB_00143677;
    }
  }
  mVar3 = MA_ERROR;
  local_48 = 0;
LAB_00143677:
  if (local_38 != (ma_uint64 *)0x0) {
    *local_38 = local_48;
  }
  return mVar3;
}

Assistant:

static ma_result ma_device_write_to_stream__pulse(ma_device* pDevice, ma_pa_stream* pStream, ma_uint64* pFramesProcessed)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 framesProcessed = 0;
    size_t bytesMapped;
    ma_uint32 bpf;
    ma_uint32 deviceState;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(pStream != NULL);

    bpf = ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
    MA_ASSERT(bpf > 0);

    deviceState = ma_device_get_state(pDevice);

    bytesMapped = ((ma_pa_stream_writable_size_proc)pDevice->pContext->pulse.pa_stream_writable_size)(pStream);
    if (bytesMapped != (size_t)-1) {
        if (bytesMapped > 0) {
            ma_uint64 framesMapped;
            void* pMappedPCMFrames;
            int pulseResult = ((ma_pa_stream_begin_write_proc)pDevice->pContext->pulse.pa_stream_begin_write)(pStream, &pMappedPCMFrames, &bytesMapped);
            if (pulseResult < 0) {
                result = ma_result_from_pulse(pulseResult);
                goto done;
            }

            framesMapped = bytesMapped / bpf;

            if (deviceState == ma_device_state_started || deviceState == ma_device_state_starting) {  /* Check for starting state just in case this is being used to do the initial fill. */
                ma_device_handle_backend_data_callback(pDevice, pMappedPCMFrames, NULL, framesMapped);
            } else {
                /* Device is not started. Write silence. */
                ma_silence_pcm_frames(pMappedPCMFrames, framesMapped, pDevice->playback.format, pDevice->playback.channels);
            }

            pulseResult = ((ma_pa_stream_write_proc)pDevice->pContext->pulse.pa_stream_write)(pStream, pMappedPCMFrames, bytesMapped, NULL, 0, MA_PA_SEEK_RELATIVE);
            if (pulseResult < 0) {
                result = ma_result_from_pulse(pulseResult);
                goto done;  /* Failed to write data to stream. */
            }

            framesProcessed += framesMapped;
        } else {
            result = MA_SUCCESS;  /* No data available for writing. */
            goto done;
        }
    } else {
        result = MA_ERROR;  /* Failed to retrieve the writable size. Abort. */
        goto done;
    }

done:
    if (pFramesProcessed != NULL) {
        *pFramesProcessed = framesProcessed;
    }

    return result;
}